

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

HeapThunk * __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::
makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,jsonnet::internal::(anonymous_namespace)::HeapObject*&,unsigned_int&,jsonnet::internal::AST*const&>
          (Interpreter *this,Identifier **args,HeapObject **args_1,uint *args_2,AST **args_3)

{
  bool bVar1;
  HeapThunk *this_00;
  _Rb_tree_node_base *p_Var2;
  Value v;
  HeapThunk *local_38;
  
  this_00 = (HeapThunk *)operator_new(0x70);
  anon_unknown_0::HeapThunk::HeapThunk(this_00,*args,*args_1,*args_2,*args_3);
  local_38 = this_00;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               *)(this + 0x18),(value_type *)&local_38);
  (this_00->super_HeapEntity).mark = (GarbageCollectionMark)this[0x10];
  *(long *)(this + 0x38) = *(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3;
  bVar1 = anon_unknown_0::Heap::checkHeap((Heap *)this);
  if (bVar1) {
    anon_unknown_0::Heap::markFrom((Heap *)this,(HeapEntity *)this_00);
    anon_unknown_0::Stack::mark((Stack *)(this + 0x50),(Heap *)this);
    v._4_4_ = 0;
    v.t = *(uint *)(this + 0x40);
    v.v.h = ((anon_union_8_3_4e909c26_for_v *)(this + 0x48))->h;
    anon_unknown_0::Heap::markFrom((Heap *)this,v);
    for (p_Var2 = *(_Rb_tree_node_base **)(this + 0xe0);
        p_Var2 != (_Rb_tree_node_base *)(this + 0xd0);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (*(HeapEntity **)(*(long *)(p_Var2 + 3) + 0x40) != (HeapEntity *)0x0) {
        anon_unknown_0::Heap::markFrom((Heap *)this,*(HeapEntity **)(*(long *)(p_Var2 + 3) + 0x40));
      }
    }
    for (p_Var2 = *(_Rb_tree_node_base **)(this + 0x1b0);
        p_Var2 != (_Rb_tree_node_base *)(this + 0x1a0);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      anon_unknown_0::Heap::markFrom((Heap *)this,*(HeapEntity **)(p_Var2 + 2));
    }
    anon_unknown_0::Heap::sweep((Heap *)this);
  }
  return this_00;
}

Assistant:

T *makeHeap(Args &&... args)
    {
        T *r = heap.makeEntity<T, Args...>(std::forward<Args>(args)...);
        if (heap.checkHeap()) {  // Do a GC cycle?
            // Avoid the object we just made being collected.
            heap.markFrom(r);

            // Mark from the stack.
            stack.mark(heap);

            // Mark from the scratch register
            heap.markFrom(scratch);

            // Mark from cached imports
            for (const auto &pair : cachedImports) {
                HeapThunk *thunk = pair.second->thunk;
                if (thunk != nullptr)
                    heap.markFrom(thunk);
            }

            for (const auto &sourceVal : sourceVals) {
                heap.markFrom(sourceVal.second);
            }

            // Delete unreachable objects.
            heap.sweep();
        }
        return r;
    }